

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TreePop(void)

{
  ImGuiID id;
  ImGuiNavLayer nav_layer;
  bool bVar1;
  uint *puVar2;
  ImRect local_2c;
  uint local_1c;
  ImGuiWindow *pIStack_18;
  ImU32 tree_depth_mask;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  window = (ImGuiWindow *)GImGui;
  pIStack_18 = GImGui->CurrentWindow;
  Unindent(0.0);
  (pIStack_18->DC).TreeDepth = (pIStack_18->DC).TreeDepth + -1;
  local_1c = 1 << ((byte)(pIStack_18->DC).TreeDepth & 0x1f);
  if ((((*(int *)&window[7].DrawListInst._TextureIdStack.Data == 0) &&
       (*(ImGuiWindow **)&window[7].FontWindowScale == pIStack_18)) &&
      (bVar1 = NavMoveRequestButNoResultYet(), bVar1)) &&
     ((((ulong)window[7].DrawListInst._OwnerName & 0x100000000) != 0 &&
      (((pIStack_18->DC).TreeJumpToParentOnPopMask & local_1c) != 0)))) {
    puVar2 = ImVector<unsigned_int>::back(&pIStack_18->IDStack);
    id = *puVar2;
    nav_layer = *(ImGuiNavLayer *)((long)&window[7].DrawListInst._Data + 4);
    ImRect::ImRect(&local_2c);
    SetNavID(id,nav_layer,0,&local_2c);
    NavMoveRequestCancel();
  }
  (pIStack_18->DC).TreeJumpToParentOnPopMask =
       local_1c - 1 & (pIStack_18->DC).TreeJumpToParentOnPopMask;
  if ((pIStack_18->IDStack).Size < 2) {
    __assert_fail("window->IDStack.Size > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                  ,0x1737,"void ImGui::TreePop()");
  }
  PopID();
  return;
}

Assistant:

void ImGui::TreePop()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    Unindent();

    window->DC.TreeDepth--;
    ImU32 tree_depth_mask = (1 << window->DC.TreeDepth);

    // Handle Left arrow to move to parent tree node (when ImGuiTreeNodeFlags_NavLeftJumpsBackHere is enabled)
    if (g.NavMoveDir == ImGuiDir_Left && g.NavWindow == window && NavMoveRequestButNoResultYet())
        if (g.NavIdIsAlive && (window->DC.TreeJumpToParentOnPopMask & tree_depth_mask))
        {
            SetNavID(window->IDStack.back(), g.NavLayer, 0, ImRect());
            NavMoveRequestCancel();
        }
    window->DC.TreeJumpToParentOnPopMask &= tree_depth_mask - 1;

    IM_ASSERT(window->IDStack.Size > 1); // There should always be 1 element in the IDStack (pushed during window creation). If this triggers you called TreePop/PopID too much.
    PopID();
}